

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O2

ui32 __thiscall mvm::test::test_instr_set::zero(test_instr_set *this)

{
  uint in_EAX;
  undefined8 uStack_8;
  
  uStack_8 = (ulong)in_EAX;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&this->call_stack,(uint *)((long)&uStack_8 + 4));
  return 0;
}

Assistant:

ui32 zero() {
    call_stack.push_back(0);
    return 0;
  }